

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_type_demo.cpp
# Opt level: O0

void ValueTypeGraphDemo(void)

{
  bool bVar1;
  reference pvVar2;
  _List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>
  *e;
  iterator __end1;
  iterator __begin1;
  vector<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>_>_>
  *__range1;
  vector<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>_>_>
  all_edges;
  Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_> graph_val;
  int i;
  vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> nodes;
  vector<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>_>_>
  *in_stack_fffffffffffffd78;
  vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *in_stack_fffffffffffffd80;
  vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *this;
  Edge *this_00;
  Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_> *this_01;
  double in_stack_fffffffffffffdb8;
  vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *this_02;
  Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>
  *in_stack_fffffffffffffdc0;
  Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_> *this_03;
  StateExample in_stack_fffffffffffffdc8;
  StateExample dstate;
  StateExample in_stack_fffffffffffffdd0;
  StateExample sstate;
  Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_> *this_04;
  __normal_iterator<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>_*,_std::vector<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>_>_>_>
  local_1d0;
  undefined1 *local_1c8;
  undefined1 local_1c0 [24];
  int64_t local_1a8;
  int64_t local_1a0;
  int64_t local_198;
  int64_t local_190;
  int64_t local_188;
  int64_t local_180;
  int64_t local_178;
  int64_t local_170;
  int64_t local_168;
  int64_t local_160;
  int64_t local_158;
  int64_t local_150;
  int64_t local_148;
  int64_t local_140;
  int64_t local_138;
  int64_t local_130;
  int64_t local_128;
  int64_t local_120;
  int64_t local_118;
  int64_t local_110;
  int64_t local_108;
  int64_t local_100;
  int64_t local_f8;
  int64_t local_f0;
  int64_t local_e8;
  int64_t local_e0;
  int64_t local_d8;
  int64_t local_d0;
  int64_t local_c8;
  int64_t local_c0;
  int64_t local_b8;
  int64_t local_b0;
  int64_t local_a8;
  int64_t local_a0;
  int64_t local_98;
  int64_t local_90;
  int64_t local_88;
  int64_t local_80;
  StateExample local_28;
  int local_1c;
  
  std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::vector
            ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)0x103414);
  for (local_1c = 0; local_1c < 9; local_1c = local_1c + 1) {
    xmotion::StateExample::StateExample(&local_28,(long)local_1c);
    std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::push_back
              (in_stack_fffffffffffffd80,(value_type *)in_stack_fffffffffffffd78);
  }
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  Graph((Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_> *)
        0x10349a);
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
                      &stack0xffffffffffffffe8,0);
  local_80 = pvVar2->id;
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
                      &stack0xffffffffffffffe8,1);
  local_88 = pvVar2->id;
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
          in_stack_fffffffffffffdb8);
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
                      &stack0xffffffffffffffe8,0);
  local_90 = pvVar2->id;
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
                      &stack0xffffffffffffffe8,3);
  local_98 = pvVar2->id;
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
          in_stack_fffffffffffffdb8);
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
                      &stack0xffffffffffffffe8,1);
  local_a0 = pvVar2->id;
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
                      &stack0xffffffffffffffe8,0);
  local_a8 = pvVar2->id;
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
          in_stack_fffffffffffffdb8);
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
                      &stack0xffffffffffffffe8,1);
  local_b0 = pvVar2->id;
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
                      &stack0xffffffffffffffe8,4);
  local_b8 = pvVar2->id;
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
          in_stack_fffffffffffffdb8);
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
                      &stack0xffffffffffffffe8,1);
  local_c0 = pvVar2->id;
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
                      &stack0xffffffffffffffe8,2);
  local_c8 = pvVar2->id;
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
          in_stack_fffffffffffffdb8);
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
                      &stack0xffffffffffffffe8,2);
  local_d0 = pvVar2->id;
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
                      &stack0xffffffffffffffe8,1);
  local_d8 = pvVar2->id;
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
          in_stack_fffffffffffffdb8);
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
                      &stack0xffffffffffffffe8,2);
  local_e0 = pvVar2->id;
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
                      &stack0xffffffffffffffe8,5);
  local_e8 = pvVar2->id;
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
          in_stack_fffffffffffffdb8);
  this_04 = (Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_> *
            )&stack0xffffffffffffffe8;
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
                      this_04,3);
  local_f0 = pvVar2->id;
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
                      this_04,0);
  local_f8 = pvVar2->id;
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
          in_stack_fffffffffffffdb8);
  sstate.id = (int64_t)&stack0xffffffffffffffe8;
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
                      sstate.id,3);
  local_100 = pvVar2->id;
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
                      sstate.id,4);
  local_108 = pvVar2->id;
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(in_stack_fffffffffffffdc0,sstate,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdb8);
  dstate.id = (int64_t)&stack0xffffffffffffffe8;
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
                      dstate.id,4);
  local_110 = pvVar2->id;
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
                      dstate.id,1);
  local_118 = pvVar2->id;
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(in_stack_fffffffffffffdc0,sstate,dstate,in_stack_fffffffffffffdb8);
  this_03 = (Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_> *
            )&stack0xffffffffffffffe8;
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
                      this_03,4);
  local_120 = pvVar2->id;
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
                      this_03,3);
  local_128 = pvVar2->id;
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(this_03,sstate,dstate,in_stack_fffffffffffffdb8);
  this_02 = (vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
            &stack0xffffffffffffffe8;
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     (this_02,4);
  local_130 = pvVar2->id;
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     (this_02,5);
  local_138 = pvVar2->id;
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(this_03,sstate,dstate,(double)this_02);
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
                      &stack0xffffffffffffffe8,5);
  local_140 = pvVar2->id;
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
                      &stack0xffffffffffffffe8,2);
  local_148 = pvVar2->id;
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(this_03,sstate,dstate,(double)this_02);
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
                      &stack0xffffffffffffffe8,5);
  local_150 = pvVar2->id;
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
                      &stack0xffffffffffffffe8,4);
  local_158 = pvVar2->id;
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(this_03,sstate,dstate,(double)this_02);
  this_01 = (Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_> *
            )&stack0xffffffffffffffe8;
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
                      this_01,5);
  local_160 = pvVar2->id;
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
                      this_01,8);
  local_168 = pvVar2->id;
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(this_03,sstate,dstate,(double)this_02);
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
                      &stack0xffffffffffffffe8,7);
  local_170 = pvVar2->id;
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
                      &stack0xffffffffffffffe8,4);
  local_178 = pvVar2->id;
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(this_03,sstate,dstate,(double)this_02);
  this_00 = (Edge *)&stack0xffffffffffffffe8;
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
                      this_00,7);
  local_180 = pvVar2->id;
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
                      this_00,8);
  local_188 = pvVar2->id;
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(this_03,sstate,dstate,(double)this_02);
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
                      &stack0xffffffffffffffe8,8);
  local_190 = pvVar2->id;
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
                      &stack0xffffffffffffffe8,5);
  local_198 = pvVar2->id;
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(this_03,sstate,dstate,(double)this_02);
  this = (vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)
         &stack0xffffffffffffffe8;
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     (this,8);
  local_1a0 = pvVar2->id;
  pvVar2 = std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::operator[]
                     (this,7);
  local_1a8 = pvVar2->id;
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(this_03,sstate,dstate,(double)this_02);
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  GetAllEdges(this_04);
  local_1c8 = local_1c0;
  local_1d0._M_current =
       (_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>
        *)std::
          vector<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>_>_>
          ::begin(in_stack_fffffffffffffd78);
  std::
  vector<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>_>_>
  ::end(in_stack_fffffffffffffd78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>_*,_std::vector<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>_>_>_>
                        *)this,(__normal_iterator<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>_*,_std::vector<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>_>_>_>
                                *)in_stack_fffffffffffffd78);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>_*,_std::vector<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>_>_>_>
    ::operator*(&local_1d0);
    std::
    _List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>
    ::operator->((_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>
                  *)0x103c95);
    xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
    Edge::PrintEdge(this_00);
    __gnu_cxx::
    __normal_iterator<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>_*,_std::vector<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>_>_>_>
    ::operator++(&local_1d0);
  }
  std::
  vector<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>_>_>
  ::~vector((vector<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>_>_>
             *)this_00);
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  ~Graph(this_01);
  std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::~vector
            ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)this_00);
  return;
}

Assistant:

void ValueTypeGraphDemo() {
  std::vector<StateExample> nodes;

  // create nodes
  for (int i = 0; i < 9; i++) {
    nodes.push_back(StateExample(i));
  }

  // create a graph
  Graph<StateExample> graph_val;

  graph_val.AddEdge(nodes[0], nodes[1], 1.0);
  graph_val.AddEdge(nodes[0], nodes[3], 1.5);
  graph_val.AddEdge(nodes[1], nodes[0], 2.0);
  graph_val.AddEdge(nodes[1], nodes[4], 2.5);
  graph_val.AddEdge(nodes[1], nodes[2], 1.0);
  graph_val.AddEdge(nodes[2], nodes[1], 1.5);
  graph_val.AddEdge(nodes[2], nodes[5], 2.0);
  graph_val.AddEdge(nodes[3], nodes[0], 2.5);
  graph_val.AddEdge(nodes[3], nodes[4], 2.5);
  graph_val.AddEdge(nodes[4], nodes[1], 2.5);
  graph_val.AddEdge(nodes[4], nodes[3], 2.5);
  graph_val.AddEdge(nodes[4], nodes[5], 2.5);
  graph_val.AddEdge(nodes[5], nodes[2], 2.5);
  graph_val.AddEdge(nodes[5], nodes[4], 2.5);
  graph_val.AddEdge(nodes[5], nodes[8], 2.5);
  graph_val.AddEdge(nodes[7], nodes[4], 2.5);
  graph_val.AddEdge(nodes[7], nodes[8], 2.5);
  graph_val.AddEdge(nodes[8], nodes[5], 2.5);
  graph_val.AddEdge(nodes[8], nodes[7], 2.5);

  auto all_edges = graph_val.GetAllEdges();
  for (auto &e : all_edges) e->PrintEdge();

  // no need to deallocate memory, all data structures are copied to graph
}